

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal.cc
# Opt level: O3

wal_item * wal_itr_search_smaller(wal_iterator *wal_itr,wal_item *query)

{
  snap_handle *psVar1;
  avl_node *paVar2;
  wal_item *pwVar3;
  
  psVar1 = wal_itr->shandle;
  if (psVar1->is_persisted_snapshot == true) {
    if (wal_itr->by_key == true) {
      paVar2 = avl_search_smaller(&psVar1->key_tree,&(query->field_12).avl_flush,_snap_cmp_bykey);
      wal_itr->cursor_pos = paVar2;
      pwVar3 = (wal_item *)&paVar2[-5].right;
    }
    else {
      paVar2 = avl_search_smaller(&psVar1->seq_tree,&query->avl_seq,_wal_cmp_byseq);
      wal_itr->cursor_pos = paVar2;
      pwVar3 = (wal_item *)&paVar2[-1].left;
    }
    if (paVar2 == (avl_node *)0x0) {
      pwVar3 = (wal_item *)0x0;
    }
  }
  else {
    if (psVar1->snap_tag_idx != 0) {
      wal_itr->direction = '\x02';
      if (wal_itr->by_key == false) {
        pwVar3 = _wal_itr_search_smaller_byseq(wal_itr,query);
        return pwVar3;
      }
      pwVar3 = _wal_itr_search_smaller_bykey(wal_itr,query);
      return pwVar3;
    }
    pwVar3 = (wal_item *)0x0;
  }
  return pwVar3;
}

Assistant:

struct wal_item* wal_itr_search_smaller(struct wal_iterator *wal_itr,
                                        struct wal_item *query)
{
    if (wal_itr->shandle->is_persisted_snapshot) {
        struct avl_node *a;
        if (wal_itr->by_key) {
            a = avl_search_smaller(&wal_itr->shandle->key_tree,
                                   &query->avl_keysnap,
                                   _snap_cmp_bykey);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_keysnap) : NULL;
        } else {
            a = avl_search_smaller(&wal_itr->shandle->seq_tree,
                                   &query->avl_seq,
                                   _wal_cmp_byseq);
            wal_itr->cursor_pos = a;
            return a ? _get_entry(a, struct wal_item, avl_seq) : NULL;
        }
    }

    if (wal_itr->shandle->snap_tag_idx) {
        wal_itr->direction = FDB_ITR_REVERSE;
        if (!wal_itr->by_key) {
            return _wal_itr_search_smaller_byseq(wal_itr, query);
        } else {
            return _wal_itr_search_smaller_bykey(wal_itr, query);
        }
    } // else no items in WAL in for this snapshot..
    return NULL;
}